

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  uint64_t uVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint64_t uVar8;
  MemoryRegion_conflict *pMVar9;
  uint64_t *puVar10;
  target_ulong *ptVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  target_ulong addr_00;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint64_t uVar19;
  uint uVar20;
  target_ulong local_a8;
  long local_a0;
  hwaddr vbase;
  int local_80;
  MemTxResult res;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  target_ulong local_60;
  hwaddr *local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    bVar3 = 0;
    uVar18 = mmu_idx;
LAB_00aa112b:
    if ((((access_type != 2) && (uVar18 == 1)) && (uVar18 = 1, (env->misa & 0x80) != 0)) &&
       (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
      uVar18 = (uint)env->mstatus >> 8 & 1;
      bVar3 = 1;
    }
  }
  else {
    uVar15 = env->mstatus;
    if (((uint)uVar15 >> 0x11 & 1) != 0) {
      uVar18 = (uint)(uVar15 >> 0xb) & 3;
      if ((env->misa & 0x80) == 0) {
        bVar3 = 0;
      }
      else {
        bVar3 = (byte)(uint)(uVar15 >> 0x27) & 1;
      }
      goto LAB_00aa112b;
    }
    uVar18 = 3;
    bVar3 = 0;
  }
  uVar20 = 0;
  if (!first_stage) {
    uVar18 = uVar20;
  }
  if ((uVar18 == 3) || ((env->features & 1) == 0)) {
    *physical = addr;
    *prot = 7;
  }
  else {
    *prot = 0;
    ptVar11 = &env->vsstatus;
    if (first_stage) {
      ptVar11 = &env->mstatus;
    }
    local_60 = *ptVar11;
    iVar5 = 10;
    local_a0 = 8;
    local_40 = 4;
    if (0x10fff < env->priv_ver) {
      lVar14 = 0x2a0;
      if (bVar3 != 0) {
        lVar14 = 0x368;
      }
      lVar7 = 0x328;
      if (first_stage) {
        lVar7 = lVar14;
      }
      uVar15 = *(ulong *)((long)env->gpr + lVar7);
      if ((uint)(uVar15 >> 0x3c) < 0xb) {
        iVar5 = (*(code *)(&DAT_00bc6ffc + *(int *)(&DAT_00bc6ffc + (uVar15 >> 0x3c) * 4)))
                          ((uVar15 & 0xfffffffffff) << 0xc,physical,(uint)env->mstatus >> 0x12 & 1);
        return iVar5;
      }
      iVar5 = 0x17f;
LAB_00aa16df:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                 ,iVar5,(char *)0x0);
    }
    uVar20 = (uint)env->mstatus;
    uVar6 = uVar20 >> 0x18 & 0x1f;
    if (uVar6 == 0) {
      *physical = addr;
      *prot = 7;
      uVar20 = 0;
    }
    else {
      uVar15 = env->sptbr;
      if (uVar6 == 8) {
        local_a0 = 4;
        local_40 = 2;
      }
      else {
        iVar5 = 9;
        if (uVar6 != 10) {
          if (uVar6 != 9) {
            iVar5 = 0x192;
            goto LAB_00aa16df;
          }
          local_40 = 3;
        }
      }
      cVar2 = (char)local_40 * (sbyte)iVar5;
      uVar17 = ~(-1L << (0x35U - cVar2 & 0x3f));
      uVar16 = addr >> (cVar2 + 0xbU & 0x3f) & uVar17;
      if (uVar16 == 0 || uVar16 == uVar17) {
        uVar6 = ((int)local_40 + -1) * iVar5;
        local_50 = (ulong)(access_type == 1) << 7 | 0x40;
        iVar13 = 0;
        local_80 = mmu_idx;
        local_78 = addr;
        local_58 = physical;
        do {
          local_a8 = uVar15 * 0x1000;
          local_70 = (ulong)uVar6;
          local_48 = local_78 >> ((byte)uVar6 + 0xc & 0x3f);
          local_68 = ~(-1L << ((byte)uVar6 & 0x3f));
          while( true ) {
            iVar12 = iVar13;
            if (iVar12 == (int)local_40) {
              return 1;
            }
            uVar15 = (ulong)(~(-1 << (sbyte)iVar5) & (uint)local_48);
            if (first_stage && two_stage) {
              get_physical_address(env,&vbase,prot,local_a8,access_type,local_80,false,true);
              addr_00 = uVar15 * local_a0 + vbase;
            }
            else {
              addr_00 = uVar15 * local_a0 + local_a8;
            }
            if (((env->features & 2) != 0) &&
               (_Var4 = pmp_hart_has_privs_riscv64
                                  ((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1), !_Var4)) {
              return 2;
            }
            uVar8 = address_space_ldq_riscv64
                              ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                               (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
            if (res != 0) {
              return 1;
            }
            if ((uVar8 & 1) == 0) {
              return 1;
            }
            uVar15 = uVar8 >> 10;
            if ((uVar8 & 0xe) == 0) break;
            iVar13 = (int)(uVar8 & 0xe);
            if (iVar13 == 4) {
              return 1;
            }
            if (iVar13 == 0xc) {
              return 1;
            }
            if ((uVar18 == 0) || ((uVar8 & 0x10) == 0)) {
              if ((uVar18 != 1) && ((uVar8 & 0x10) == 0)) {
                return 1;
              }
            }
            else if (access_type == 2 || (uVar20 >> 0x12 & 1) != 0) {
              return 1;
            }
            if ((local_68 & uVar15) != 0) {
              return 1;
            }
            if ((access_type == 0) && ((uVar8 & 2) == 0)) {
              if ((uVar8 & 8) == 0) {
                return 1;
              }
              uVar16 = local_60 & 0x80000;
joined_r0x00aa1567:
              if (uVar16 == 0) {
                return 1;
              }
            }
            else {
              if ((access_type == 1) && ((uVar8 & 4) == 0)) {
                return 1;
              }
              if (access_type == 2) {
                uVar16 = uVar8 & 8;
                goto joined_r0x00aa1567;
              }
            }
            uVar16 = local_50 | uVar8;
            uVar19 = uVar8;
            if (uVar16 == uVar8) goto LAB_00aa1630;
            vbase = 8;
            pMVar9 = flatview_translate_riscv64
                               (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                                *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,false
                                ,(MemTxAttrs)0x1);
            if (pMVar9->ram == false) {
              return 1;
            }
            puVar10 = (uint64_t *)
                      qemu_map_ram_ptr_riscv64
                                ((uc_struct_conflict13 *)pMVar9->uc,pMVar9->ram_block,addr1);
            LOCK();
            uVar1 = *puVar10;
            if (uVar8 == uVar1) {
              *puVar10 = uVar16;
            }
            UNLOCK();
            uVar19 = uVar16;
            iVar13 = 0;
            if (uVar8 == uVar1) {
LAB_00aa1630:
              if (iVar12 == 0) {
                local_68 = ~(-1L << ((byte)local_70 & 0x3f));
              }
              *local_58 = (uVar15 | local_68 & local_78 >> 0xc) << 0xc;
              if (((uVar19 & 2) != 0) ||
                 (((byte)((uVar19 & 0xffffffff) >> 3) & 0x1f & (byte)(local_60 >> 0x13) & 1) != 0))
              {
                *(byte *)prot = (byte)*prot | 1;
              }
              if ((uVar19 & 8) != 0) {
                *(byte *)prot = (byte)*prot | 4;
              }
              if ((uVar19 & 4) == 0) {
                return 0;
              }
              if ((access_type != 1) && ((uVar19 & 0x80) == 0)) {
                return 0;
              }
              *(byte *)prot = (byte)*prot | 2;
              return 0;
            }
          }
          iVar13 = iVar12 + 1;
          uVar6 = (int)local_70 - iVar5;
        } while( true );
      }
      uVar20 = 1;
    }
  }
  return uVar20;
}

Assistant:

static int get_physical_address(CPUMIPSState *env, hwaddr *physical,
                                int *prot, target_ulong real_address,
                                int rw, int access_type, int mmu_idx)
{
    /* User mode can only access useg/xuseg */
#if defined(TARGET_MIPS64)
    int user_mode = mmu_idx == MIPS_HFLAG_UM;
    int supervisor_mode = mmu_idx == MIPS_HFLAG_SM;
    int kernel_mode = !user_mode && !supervisor_mode;
    int UX = (env->CP0_Status & (1 << CP0St_UX)) != 0;
    int SX = (env->CP0_Status & (1 << CP0St_SX)) != 0;
    int KX = (env->CP0_Status & (1 << CP0St_KX)) != 0;
#endif
    int ret = TLBRET_MATCH;
    /* effective address (modified for KVM T&E kernel segments) */
    target_ulong address = real_address;

#define USEG_LIMIT      ((target_ulong)(int32_t)0x7FFFFFFFUL)
#define KSEG0_BASE      ((target_ulong)(int32_t)0x80000000UL)
#define KSEG1_BASE      ((target_ulong)(int32_t)0xA0000000UL)
#define KSEG2_BASE      ((target_ulong)(int32_t)0xC0000000UL)
#define KSEG3_BASE      ((target_ulong)(int32_t)0xE0000000UL)

#define KVM_KSEG0_BASE  ((target_ulong)(int32_t)0x40000000UL)
#define KVM_KSEG2_BASE  ((target_ulong)(int32_t)0x60000000UL)

#if 0
    if (mips_um_ksegs_enabled()) {
        /* KVM T&E adds guest kernel segments in useg */
        if (real_address >= KVM_KSEG0_BASE) {
            if (real_address < KVM_KSEG2_BASE) {
                /* kseg0 */
                address += KSEG0_BASE - KVM_KSEG0_BASE;
            } else if (real_address <= USEG_LIMIT) {
                /* kseg2/3 */
                address += KSEG2_BASE - KVM_KSEG2_BASE;
            }
        }
    }
#endif

    if (address <= USEG_LIMIT) {
        /* useg */
        uint16_t segctl;

        if (address >= 0x40000000UL) {
            segctl = env->CP0_SegCtl2;
        } else {
            segctl = env->CP0_SegCtl2 >> 16;
        }
        ret = get_segctl_physical_address(env, physical, prot,
                                          real_address, rw, access_type,
                                          mmu_idx, segctl, 0x3FFFFFFF);
#if defined(TARGET_MIPS64)
    } else if (address < 0x4000000000000000ULL) {
        /* xuseg */
        if (UX && address <= (0x3FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0x8000000000000000ULL) {
        /* xsseg */
        if ((supervisor_mode || kernel_mode) &&
            SX && address <= (0x7FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xC000000000000000ULL) {
        /* xkphys */
        if ((address & 0x07FFFFFFFFFFFFFFULL) <= env->PAMask) {
            /* KX/SX/UX bit to check for each xkphys EVA access mode */
            static const uint8_t am_ksux[8] = {
                [CP0SC_AM_UK]    = (1u << CP0St_KX),
                [CP0SC_AM_MK]    = (1u << CP0St_KX),
                [CP0SC_AM_MSK]   = (1u << CP0St_SX),
                [CP0SC_AM_MUSK]  = (1u << CP0St_UX),
                [CP0SC_AM_MUSUK] = (1u << CP0St_UX),
                [CP0SC_AM_USK]   = (1u << CP0St_SX),
                [6]              = (1u << CP0St_KX),
                [CP0SC_AM_UUSK]  = (1u << CP0St_UX),
            };
            unsigned int am = CP0SC_AM_UK;
            unsigned int xr = (env->CP0_SegCtl2 & CP0SC2_XR_MASK) >> CP0SC2_XR;

            if (xr & (1 << ((address >> 59) & 0x7))) {
                am = (env->CP0_SegCtl1 & CP0SC1_XAM_MASK) >> CP0SC1_XAM;
            }
            /* Does CP0_Status.KX/SX/UX permit the access mode (am) */
            if (env->CP0_Status & am_ksux[am]) {
                ret = get_seg_physical_address(env, physical, prot,
                                               real_address, rw, access_type,
                                               mmu_idx, am, false, env->PAMask,
                                               0);
            } else {
                ret = TLBRET_BADADDR;
            }
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xFFFFFFFF80000000ULL) {
        /* xkseg */
        if (kernel_mode && KX &&
            address <= (0xFFFFFFFF7FFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
#endif
    } else if (address < KSEG1_BASE) {
        /* kseg0 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1 >> 16, 0x1FFFFFFF);
    } else if (address < KSEG2_BASE) {
        /* kseg1 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1, 0x1FFFFFFF);
    } else if (address < KSEG3_BASE) {
        /* sseg (kseg2) */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0 >> 16, 0x1FFFFFFF);
    } else {
        /*
         * kseg3
         * XXX: debug segment is not emulated
         */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0, 0x1FFFFFFF);
    }
    return ret;
}